

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O2

bc_error_t *
bc_error_parser(bc_error_type_t type,char *src,size_t src_len,size_t current,char *format,...)

{
  char cVar1;
  long lVar2;
  char in_AL;
  char *msg;
  ulong uVar3;
  ulong uVar4;
  char *__ptr;
  bc_error_t *pbVar5;
  ulong uVar6;
  long lVar7;
  undefined8 in_R9;
  long lVar8;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  undefined1 local_e8 [40];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_c0 = in_R9;
  if (format == (char *)0x0) {
    pbVar5 = bc_error_new(type,"");
    return pbVar5;
  }
  ap[0].reg_save_area = local_e8;
  ap[0].overflow_arg_area = &stack0x00000008;
  ap[0].gp_offset = 0x28;
  ap[0].fp_offset = 0x30;
  msg = bc_strdup_vprintf(format,ap);
  lVar2 = 1;
  uVar3 = 0;
  uVar6 = 0;
  lVar7 = lVar2;
  lVar8 = lVar2;
  while (uVar6 < src_len) {
    cVar1 = src[uVar6];
    if (uVar6 < current) {
      uVar4 = uVar6 + 1;
      if (uVar4 < src_len) {
        if (cVar1 == '\r') {
          if (src[uVar4] != '\n') goto LAB_00108a25;
        }
        else {
          if (cVar1 != '\n') goto LAB_00108a16;
          if (src[uVar4] != '\r') goto LAB_00108a25;
        }
        lVar8 = lVar8 + 1;
        lVar7 = lVar2;
        if (uVar6 + 2 < src_len) {
          uVar3 = uVar6 + 2;
        }
      }
      else {
        uVar4 = uVar3;
        if ((cVar1 == '\r') || (cVar1 == '\n')) {
LAB_00108a25:
          lVar8 = lVar8 + 1;
          uVar3 = uVar4;
          uVar4 = uVar6;
          lVar7 = lVar2;
        }
        else {
LAB_00108a16:
          uVar4 = uVar6;
          lVar7 = lVar7 + 1;
        }
      }
    }
    else if ((cVar1 == '\n') || (uVar4 = uVar6, cVar1 == '\r')) goto LAB_00108a51;
    uVar6 = uVar4 + 1;
  }
  uVar6 = 0;
LAB_00108a51:
  uVar4 = src_len;
  if (uVar3 < uVar6) {
    uVar4 = uVar6;
  }
  if (src_len < uVar3) {
    uVar4 = uVar6;
  }
  __ptr = bc_strndup(src + uVar3,uVar4 - uVar3);
  if (*__ptr == '\0') {
    pbVar5 = bc_error_new(type,msg);
  }
  else {
    pbVar5 = bc_error_new_printf(type,"%s\nError occurred near line %d, position %d: %s",msg,lVar8,
                                 lVar7,__ptr);
  }
  free(msg);
  free(__ptr);
  return pbVar5;
}

Assistant:

bc_error_t*
bc_error_parser(bc_error_type_t type, const char *src, size_t src_len,
    size_t current, const char *format, ...)
{
    if (format == NULL)
        return bc_error_new(type, "");
    va_list ap;
    va_start(ap, format);
    char *msg = bc_strdup_vprintf(format, ap);
    va_end(ap);

    size_t lineno = 1;
    size_t linestart = 0;
    size_t lineend = 0;
    size_t pos = 1;

    for (size_t i = 0; i < src_len; i++) {
        char c = src[i];
        if (i < current) {
            if ((i + 1) < src_len) {
                if ((c == '\n' && src[i + 1] == '\r') ||
                    (c == '\r' && src[i + 1] == '\n'))
                {
                    lineno++;
                    i++;
                    pos = 1;
                    if ((i + 1) < src_len)
                        linestart = i + 1;
                    continue;
                }
            }
            if (c == '\n' || c == '\r') {
                lineno++;
                pos = 1;
                if ((i + 1) < src_len)
                    linestart = i + 1;
                continue;
            }
            pos++;
        }
        else if (c == '\n' || c == '\r') {
            lineend = i;
            break;
        }
    }

    if (lineend <= linestart && src_len >= linestart)
        lineend = src_len;

    char *line = bc_strndup(src + linestart, lineend - linestart);

    bc_error_t *rv = NULL;

    if (line[0] == '\0')  // "near" message isn't useful if line is empty
        rv = bc_error_new(type, msg);
    else
        rv = bc_error_new_printf(type,
            "%s\nError occurred near line %d, position %d: %s", msg, lineno,
            pos, line);

    free(msg);
    free(line);

    return rv;
}